

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dec.c
# Opt level: O0

void TrueMotion(uint8_t *dst,uint8_t *left,uint8_t *top,int size)

{
  byte bVar1;
  byte bVar2;
  int in_ECX;
  long in_RDX;
  long in_RSI;
  long in_RDI;
  int x;
  uint8_t *clip_table;
  uint8_t *clip;
  int y;
  int in_stack_ffffffffffffffc8;
  int in_stack_ffffffffffffffcc;
  int iVar3;
  uint8_t *in_stack_ffffffffffffffd0;
  int local_20;
  long local_8;
  
  if (in_RSI == 0) {
    if (in_RDX == 0) {
      Fill(in_stack_ffffffffffffffd0,in_stack_ffffffffffffffcc,in_stack_ffffffffffffffc8);
    }
    else {
      VerticalPred(in_stack_ffffffffffffffd0,
                   (uint8_t *)CONCAT44(in_stack_ffffffffffffffcc,in_stack_ffffffffffffffc8),0);
    }
  }
  else if (in_RDX == 0) {
    HorizontalPred(in_stack_ffffffffffffffd0,
                   (uint8_t *)CONCAT44(in_stack_ffffffffffffffcc,in_stack_ffffffffffffffc8),0);
  }
  else {
    bVar1 = *(byte *)(in_RSI + -1);
    local_8 = in_RDI;
    for (local_20 = 0; local_20 < in_ECX; local_20 = local_20 + 1) {
      bVar2 = *(byte *)(in_RSI + local_20);
      for (iVar3 = 0; iVar3 < in_ECX; iVar3 = iVar3 + 1) {
        *(uint8_t *)(local_8 + iVar3) =
             clip1[(ulong)*(byte *)(in_RDX + iVar3) +
                   (long)(int)(uint)bVar2 + (0xff - (long)(int)(uint)bVar1)];
      }
      local_8 = local_8 + 0x20;
    }
  }
  return;
}

Assistant:

static WEBP_INLINE void TrueMotion(uint8_t* dst, int size) {
  const uint8_t* top = dst - BPS;
  const uint8_t* const clip0 = VP8kclip1 - top[-1];
  int y;
  for (y = 0; y < size; ++y) {
    const uint8_t* const clip = clip0 + dst[-1];
    int x;
    for (x = 0; x < size; ++x) {
      dst[x] = clip[top[x]];
    }
    dst += BPS;
  }
}